

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_8c5559::ForcedKeyTestLarge::Frame1IsKey(ForcedKeyTestLarge *this)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  char cVar4;
  bool bVar5;
  int limit;
  SEARCH_METHODS *message;
  long lVar6;
  AssertHelper local_e0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_98;
  I420VideoSource video;
  
  iVar1 = *(int *)&(this->super_EncoderTest).field_0x3dc;
  this->forced_kf_frame_num_ = 1;
  lVar6 = 0;
  do {
    uVar2 = *(uint *)(&DAT_00c54210 + (ulong)(iVar1 == 0) * 0xc + lVar6 * 4);
    if (uVar2 == 0xffffffff) {
      if (1 < (uint)lVar6) {
        return;
      }
    }
    else {
      this->frame_num_ = 0;
      (this->super_EncoderTest).cfg_.g_lag_in_frames = uVar2;
      this->is_kf_placement_violated_ = false;
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface =
           (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
      limit = 0x3c;
      if (this->fwd_kf_enabled_ == 0) {
        limit = 0x1e;
      }
      libaom_test::YUVVideoSource::YUVVideoSource
                (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420
                 ,0x160,0x120,0x1e,1,0,limit);
      video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
           (_func_int **)&PTR__YUVVideoSource_01044d00;
      if ((TestPartResultReporterInterface **)
          gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_)
      {
        operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface);
      }
      bVar5 = testing::internal::AlwaysTrue();
      if (!bVar5) {
LAB_004f4cb4:
        testing::Message::Message((Message *)&gtest_fatal_failure_checker);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
                   ,0x139,
                   "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                  );
        testing::internal::AssertHelper::operator=
                  (&local_e0,(Message *)&gtest_fatal_failure_checker);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
            _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
          (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface + 8))();
        }
        libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
        return;
      }
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                (&gtest_fatal_failure_checker);
      bVar5 = testing::internal::AlwaysTrue();
      if (bVar5) {
        (*(this->super_EncoderTest)._vptr_EncoderTest[2])(&this->super_EncoderTest,&video);
      }
      bVar5 = gtest_fatal_failure_checker.has_new_fatal_failure_;
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                (&gtest_fatal_failure_checker);
      if (bVar5 != false) goto LAB_004f4cb4;
      local_e0.data_._0_1_ = 0;
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&gtest_fatal_failure_checker,"is_kf_placement_violated_","false",
                 &this->is_kf_placement_violated_,(bool *)&local_e0);
      cVar4 = (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface;
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) + 0x10),"Frame #"
                   ,7);
        std::ostream::_M_insert<unsigned_long>
                  (CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) + 0x10),
                   " isn\'t a keyframe!",0x12);
        message = "";
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
          message = *(SEARCH_METHODS **)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
                   ,0x13a,(char *)message);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if ((long *)CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_e0.data_._1_7_,local_e0.data_._0_1_) + 8))();
        }
      }
      puVar3 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar3 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar3 != puVar3 + 2) {
          operator_delete((undefined8 *)*puVar3);
        }
        operator_delete(puVar3);
      }
      libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
      if (1 < (uint)lVar6) {
        return;
      }
      if (cVar4 == '\0') {
        return;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void ForcedKeyTestLarge::Frame1IsKey() {
  const aom_rational timebase = { 1, 30 };
  // 1st element of this 2D array is for good encoding mode and 2nd element
  // is for RT encoding mode.
  const int lag_values[2][NUM_LAG_VALUES] = { { 3, 15, 25 }, { 0, -1, -1 } };
  int is_realtime = (encoding_mode_ == ::libaom_test::kRealTime);

  forced_kf_frame_num_ = 1;
  for (int i = 0; i < NUM_LAG_VALUES; ++i) {
    if (lag_values[is_realtime][i] == -1) continue;
    frame_num_ = 0;
    cfg_.g_lag_in_frames = lag_values[is_realtime][i];
    is_kf_placement_violated_ = false;
    libaom_test::I420VideoSource video(
        TestFileName(), TestFileWidth(), TestFileHeight(), timebase.den,
        timebase.num, 0, fwd_kf_enabled_ ? 60 : 30);
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_EQ(is_kf_placement_violated_, false)
        << "Frame #" << frame_num_ << " isn't a keyframe!";
  }
}